

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QFont>>::
emplaceValue<QStyleSheetStyleCaches::Tampered<QFont>>
          (Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QFont>> *this,Tampered<QFont> *args)

{
  undefined4 uVar1;
  undefined8 uVar2;
  long in_FS_OFFSET;
  undefined8 local_38;
  undefined4 local_30;
  uint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QFont::QFont((QFont *)&local_38,&args->oldWidgetValue);
  local_28 = args->resolveMask;
  uVar2 = *(undefined8 *)(this + 8);
  *(undefined8 *)(this + 8) = local_38;
  uVar1 = *(undefined4 *)(this + 0x10);
  *(undefined4 *)(this + 0x10) = local_30;
  *(uint *)(this + 0x18) = local_28;
  local_38 = uVar2;
  local_30 = uVar1;
  QFont::~QFont((QFont *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }